

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

char * __thiscall cmGeneratorTarget::GetSourcesProperty(cmGeneratorTarget *this)

{
  pointer ppTVar1;
  _Alloc_hider _Var2;
  int iVar3;
  undefined4 extraout_var;
  pointer ppTVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string local_38;
  
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppTVar1 = (this->SourceEntries).
            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar4 = (this->SourceEntries).
                 super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppTVar4 != ppTVar1;
      ppTVar4 = ppTVar4 + 1) {
    iVar3 = (*(*ppTVar4)->_vptr_TargetPropertyEntry[5])();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_58,(value_type *)CONCAT44(extraout_var,iVar3));
  }
  if (GetSourcesProperty()::value_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&GetSourcesProperty()::value_abi_cxx11_);
    if (iVar3 != 0) {
      GetSourcesProperty()::value_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GetSourcesProperty()::value_abi_cxx11_.field_2;
      GetSourcesProperty()::value_abi_cxx11_._M_string_length = 0;
      GetSourcesProperty()::value_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,&GetSourcesProperty()::value_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GetSourcesProperty()::value_abi_cxx11_);
    }
  }
  GetSourcesProperty()::value_abi_cxx11_._M_string_length = 0;
  *GetSourcesProperty()::value_abi_cxx11_._M_dataplus._M_p = '\0';
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_38,&local_58,";");
  std::__cxx11::string::operator=
            ((string *)&GetSourcesProperty()::value_abi_cxx11_,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  _Var2 = GetSourcesProperty()::value_abi_cxx11_._M_dataplus;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return _Var2._M_p;
}

Assistant:

const char* cmGeneratorTarget::GetSourcesProperty() const
{
  std::vector<std::string> values;
  for (TargetPropertyEntry* se : this->SourceEntries) {
    values.push_back(se->GetInput());
  }
  static std::string value;
  value.clear();
  value = cmJoin(values, ";");
  return value.c_str();
}